

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
          (DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *this,Formula **key)

{
  uint uVar1;
  uint uVar2;
  Entry *pEVar3;
  Formula *pFVar4;
  type tVar5;
  Entry *pEVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  Entry *pEVar10;
  
  if (this->_capacity == 0) {
    pEVar10 = (Entry *)0x0;
  }
  else {
    tVar5 = DefaultHash::hash<Kernel::Formula>(*key,0x811c9dc5);
    uVar1 = this->_capacity;
    uVar7 = (ulong)tVar5 % (ulong)uVar1;
    pEVar3 = this->_entries;
    uVar9 = pEVar3[uVar7].field_0._infoData;
    pEVar10 = (Entry *)0x0;
    if (uVar9 >> 2 == this->_timestamp) {
      pEVar6 = pEVar3 + uVar7;
      pFVar4 = *key;
      if (pEVar6->_key == pFVar4) {
        uVar9 = uVar9 & 1;
      }
      else {
        if ((uVar9 & 2) == 0) {
          return (Entry *)0x0;
        }
        iVar8 = (int)(((ulong)pFVar4 & 0xffffffff) % (ulong)uVar1);
        do {
          uVar7 = (ulong)((int)uVar7 + iVar8 + (uint)(iVar8 == 0)) % (ulong)uVar1;
          pEVar6 = pEVar3 + uVar7;
          uVar2 = pEVar3[uVar7].field_0._infoData;
          if (uVar2 >> 2 != uVar9 >> 2) break;
        } while (pEVar6->_key != pFVar4);
        uVar9 = uVar2 & 1 | (uVar2 ^ uVar9) >> 2;
      }
      pEVar10 = (Entry *)0x0;
      if (uVar9 == 0) {
        pEVar10 = pEVar6;
      }
    }
  }
  return pEVar10;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }